

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O0

Status * __thiscall draco::Decoder::DecodeBufferToGeometryStep2(Decoder *this)

{
  bool bVar1;
  Status *in_RDI;
  Status _local_status;
  pointer in_stack_ffffffffffffff88;
  Status *this_00;
  Status local_38;
  
  this_00 = in_RDI;
  std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>::operator->
            ((unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_> *)0x14e6ae);
  MeshDecoder::DecodeStep2(in_stack_ffffffffffffff88);
  std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>::reset
            ((unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_> *)this_00,
             in_stack_ffffffffffffff88);
  bVar1 = Status::ok(&local_38);
  if (bVar1) {
    OkStatus();
  }
  else {
    Status::Status(this_00,(Status *)in_stack_ffffffffffffff88);
  }
  Status::~Status((Status *)0x14e73b);
  return in_RDI;
}

Assistant:

Status Decoder::DecodeBufferToGeometryStep2() {
#ifdef DRACO_MESH_COMPRESSION_SUPPORTED
  const draco::Status _local_status = decoder_->DecodeStep2();
  decoder_.reset();
  if (!_local_status.ok()) {
    return _local_status;
  }
  return OkStatus();
#else
  return Status(Status::DRACO_ERROR, "Unsupported geometry type.");
#endif
}